

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseBase.h
# Opt level: O3

void __thiscall
Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
swap<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,0>>
          (DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *this,
          DenseBase<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>
          *other)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  swap_assign_op<double> local_69;
  DstEvaluatorType local_68;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>,_Eigen::internal::swap_assign_op<double>,_0>
  local_50;
  SrcEvaluatorType local_30;
  
  local_30.
  super_unary_evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>,_Eigen::internal::IndexBased,_double>
  .m_rows.m_value = *(long *)(this + 8);
  if ((local_30.
       super_unary_evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>,_Eigen::internal::IndexBased,_double>
       .m_rows.m_value == *(long *)(other + 8)) &&
     (*(long *)(this + 0x10) == *(long *)(other + 0x10))) {
    local_30.
    super_unary_evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_data = *(PointerType *)other;
    local_50.
    super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>,_Eigen::internal::swap_assign_op<double>,_1>
    .m_src = &local_30;
    local_30.
    super_unary_evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_outerStride.m_value = *(long *)(other + 0x30);
    local_68.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_data = *(PointerType *)this;
    local_50.
    super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>,_Eigen::internal::swap_assign_op<double>,_1>
    .m_dst = &local_68;
    local_68.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_outerStride.m_value = *(long *)(this + 0x30);
    local_50.
    super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>,_Eigen::internal::swap_assign_op<double>,_1>
    .m_functor = &local_69;
    local_50.
    super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>,_Eigen::internal::swap_assign_op<double>,_1>
    .m_dstExpr = (DstXprType *)this;
    internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>_>,_Eigen::internal::swap_assign_op<double>,_0>,_4,_0>
    ::run(&local_50);
    return;
  }
  __assert_fail("rows()==other.rows() && cols()==other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/DenseBase.h"
                ,0x1a1,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::swap(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, OtherDerived = Eigen::Reverse<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    void swap(const DenseBase<OtherDerived>& other)
    {
      EIGEN_STATIC_ASSERT(!OtherDerived::IsPlainObjectBase,THIS_EXPRESSION_IS_NOT_A_LVALUE__IT_IS_READ_ONLY);
      eigen_assert(rows()==other.rows() && cols()==other.cols());
      call_assignment(derived(), other.const_cast_derived(), internal::swap_assign_op<Scalar>());
    }